

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

Status __thiscall leveldb::Footer::DecodeFrom(Footer *this,Slice *input)

{
  bool bVar1;
  char *d;
  char *pcVar2;
  size_t sVar3;
  Slice *in_RDX;
  Status *in_RDI;
  char *end;
  uint64_t magic;
  uint32_t magic_hi;
  uint32_t magic_lo;
  char *magic_ptr;
  Status *result;
  Status *in_stack_ffffffffffffff58;
  Slice *in_stack_ffffffffffffff60;
  Slice *in_stack_ffffffffffffff68;
  char *local_78;
  Slice *in_stack_ffffffffffffff90;
  BlockHandle *in_stack_ffffffffffffff98;
  char *pcVar4;
  Slice local_50 [2];
  long local_30;
  uint32_t local_28;
  uint32_t local_24;
  char *local_20;
  Slice *local_18;
  
  local_18 = in_RDX;
  local_20 = Slice::data(in_RDX);
  local_20 = local_20 + 0x28;
  local_24 = DecodeFixed32(local_20);
  local_28 = DecodeFixed32(local_20 + 4);
  local_30 = CONCAT44(local_28,local_24);
  if (local_30 == -0x24b88adb747f04a9) {
    BlockHandle::DecodeFrom(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    bVar1 = Status::ok(in_RDI);
    if (bVar1) {
      BlockHandle::DecodeFrom(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      Status::operator=((Status *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      Status::~Status((Status *)in_stack_ffffffffffffff60);
    }
    bVar1 = Status::ok(in_RDI);
    if (bVar1) {
      d = local_20 + 8;
      pcVar4 = d;
      pcVar2 = Slice::data(local_18);
      sVar3 = Slice::size(local_18);
      Slice::Slice((Slice *)&local_78,d,(size_t)(pcVar2 + (sVar3 - (long)pcVar4)));
      local_18->data_ = local_78;
      local_18->size_ = (size_t)in_stack_ffffffffffffff90;
    }
  }
  else {
    Slice::Slice(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
    Slice::Slice(local_50);
    Status::Corruption(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  }
  return (Status)(char *)in_RDI;
}

Assistant:

Status Footer::DecodeFrom(Slice* input) {
  const char* magic_ptr = input->data() + kEncodedLength - 8;
  const uint32_t magic_lo = DecodeFixed32(magic_ptr);
  const uint32_t magic_hi = DecodeFixed32(magic_ptr + 4);
  const uint64_t magic = ((static_cast<uint64_t>(magic_hi) << 32) |
                          (static_cast<uint64_t>(magic_lo)));
  if (magic != kTableMagicNumber) {
    return Status::Corruption("not an sstable (bad magic number)");
  }

  Status result = metaindex_handle_.DecodeFrom(input);
  if (result.ok()) {
    result = index_handle_.DecodeFrom(input);
  }
  if (result.ok()) {
    // We skip over any leftover data (just padding for now) in "input"
    const char* end = magic_ptr + 8;
    *input = Slice(end, input->data() + input->size() - end);
  }
  return result;
}